

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void recognize_face(Mat *face,Net *net,vector<float,_std::allocator<float>_> *fv)

{
  long lVar1;
  int i;
  long lVar2;
  allocator local_169;
  Mat vec;
  undefined4 uStack_164;
  ulong local_158 [10];
  Mat probMat;
  undefined8 local_a8;
  _InputArray *local_a0;
  undefined8 local_98;
  Mat blob;
  
  local_158[0] = 0;
  _vec = (ulong *)CONCAT44(uStack_164,0x1010000);
  local_a8 = 0x6000000060;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&probMat);
  _probMat = 0;
  cv::dnn::dnn4_v20211004::blobFromImage
            ((_InputArray *)&blob,0.00392156862745098,(Size_ *)&vec,(Scalar_ *)&local_a8,
             SUB81(&probMat,0),true,0);
  local_98 = 0;
  local_a8 = CONCAT44(local_a8._4_4_,0x1010000);
  local_a0 = (_InputArray *)&blob;
  std::__cxx11::string::string((string *)&probMat,"",&local_169);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&vec);
  cv::dnn::dnn4_v20211004::Net::setInput
            ((_InputArray *)net,(string *)&local_a8,1.0,(Scalar_ *)&probMat);
  std::__cxx11::string::~string((string *)&probMat);
  _vec = local_158;
  local_158[0] = local_158[0] & 0xffffffffffffff00;
  cv::dnn::dnn4_v20211004::Net::forward((string *)&probMat);
  std::__cxx11::string::~string((string *)&vec);
  cv::Mat::reshape((int)&vec,(int)&probMat);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < 0; lVar2 = lVar2 + 1) {
    std::vector<float,_std::allocator<float>_>::push_back
              (fv,(value_type_conflict1 *)(local_158[0] + lVar1));
    lVar1 = lVar1 + 4;
  }
  cv::Mat::~Mat(&vec);
  cv::Mat::~Mat(&probMat);
  cv::Mat::~Mat(&blob);
  return;
}

Assistant:

void recognize_face(Mat& face, Net net, vector<float> &fv){
    Mat blob = blobFromImage(face, 1/255.0, Size(96, 96),
            Scalar(0, 0, 0), true, false);
    net.setInput(blob);
    Mat probMat = net.forward();
    Mat vec = probMat.reshape(1, 1);

    for(int i = 0; i < vec.cols; i++){
        fv.push_back(vec.at<float>(0, i));
    }
}